

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_originator.c
# Opt level: O0

void olsrv2_originator_cleanup(void)

{
  list_entity *plVar1;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  olsrv2_originator_set_entry *e_it;
  olsrv2_originator_set_entry *entry;
  
  e_it = (olsrv2_originator_set_entry *)&_originator_set_tree.list_head.next[-2].prev;
  plVar1 = (_originator_set_tree.list_head.next)->next;
  while( true ) {
    __tempptr = (list_entity *)&plVar1[-2].prev;
    if ((e_it->_node).list.prev == _originator_set_tree.list_head.prev) break;
    _remove_originator_entry(e_it);
    e_it = (olsrv2_originator_set_entry *)__tempptr;
    plVar1 = plVar1->next;
  }
  oonf_timer_remove(&_originator_entry_timer);
  oonf_class_remove(&_originator_entry_class);
  return;
}

Assistant:

void
olsrv2_originator_cleanup(void) {
  struct olsrv2_originator_set_entry *entry, *e_it;

  /* remove all originator entries */
  avl_for_each_element_safe(&_originator_set_tree, entry, _node, e_it) {
    _remove_originator_entry(entry);
  }

  /* remove timer and class */
  oonf_timer_remove(&_originator_entry_timer);
  oonf_class_remove(&_originator_entry_class);
}